

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetectorOutput.h
# Opt level: O2

void __thiscall DetectorOutput::~DetectorOutput(DetectorOutput *this)

{
  __node_base *p_Var1;
  
  (**(code **)(*(long *)(this->_det)._M_t.
                        super___uniq_ptr_impl<Detector,_std::default_delete<Detector>_>._M_t.
                        super__Tuple_impl<0UL,_Detector_*,_std::default_delete<Detector>_>.
                        super__Head_base<0UL,_Detector_*,_false>._M_head_impl + 0x20))();
  p_Var1 = &(this->tls)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    operator_delete(*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor
                    ,8);
  }
  std::operator<<((ostream *)&std::cout,"finished ");
  std::unique_ptr<Detector,_std::default_delete<Detector>_>::~unique_ptr(&this->_det);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_libdetector).
              super___shared_ptr<util::LibraryLoader,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_void_**>,_std::allocator<std::pair<const_unsigned_int,_void_**>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_void_**>,_std::allocator<std::pair<const_unsigned_int,_void_**>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)this);
  return;
}

Assistant:

~DetectorOutput() {
    _det->finalize();
    for (auto it = tls.begin(); it != tls.end(); it++) {
      delete it->second;
    }
    std::cout << "finished ";
  }